

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_start_popup(nk_context *ctx,nk_window *win)

{
  nk_popup_buffer *pnVar1;
  nk_popup_buffer *buf;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3b32,"void nk_start_popup(struct nk_context *, struct nk_window *)");
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3b33,"void nk_start_popup(struct nk_context *, struct nk_window *)");
  }
  if ((ctx != (nk_context *)0x0) && (win != (nk_window *)0x0)) {
    pnVar1 = &(win->popup).buf;
    pnVar1->begin = (win->buffer).end;
    (win->popup).buf.end = (win->buffer).end;
    (win->popup).buf.parent = (win->buffer).last;
    (win->popup).buf.last = pnVar1->begin;
    (win->popup).buf.active = 1;
  }
  return;
}

Assistant:

NK_LIB void
nk_start_popup(struct nk_context *ctx, struct nk_window *win)
{
    struct nk_popup_buffer *buf;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!ctx || !win) return;

    /* save buffer fill state for popup */
    buf = &win->popup.buf;
    buf->begin = win->buffer.end;
    buf->end = win->buffer.end;
    buf->parent = win->buffer.last;
    buf->last = buf->begin;
    buf->active = nk_true;
}